

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O2

void __thiscall FGLRenderer::BindTonemapPalette(FGLRenderer *this,int texunit)

{
  BYTE BVar1;
  BYTE BVar2;
  uchar *buffer;
  AActor *pAVar3;
  uint uVar4;
  FHardwareTexture *this_00;
  FShaderManager *pFVar5;
  ulong uVar6;
  int b;
  ulong uVar7;
  FGLRenderer *this_01;
  uint *puVar8;
  long lVar9;
  TArray<unsigned_char,_unsigned_char> lut;
  FString local_58;
  AActor *local_50;
  FShaderManager *local_48;
  uint *local_40;
  ulong local_38;
  
  if (this->mTonemapPalette != (FHardwareTexture *)0x0) {
    FHardwareTexture::Bind(this->mTonemapPalette,texunit,0,false);
    return;
  }
  this_01 = (FGLRenderer *)&lut;
  lut.Array = (uchar *)0x0;
  lut.Most = 0;
  lut.Count = 0;
  TArray<unsigned_char,_unsigned_char>::Resize
            ((TArray<unsigned_char,_unsigned_char> *)this_01,0x100000);
  puVar8 = (uint *)0x0;
  pFVar5 = (FShaderManager *)0x0;
  local_50 = (AActor *)this;
  while (pAVar3 = local_50, pFVar5 != (FShaderManager *)0x40) {
    uVar6 = 0;
    local_48 = pFVar5;
    local_40 = puVar8;
    while (uVar6 != 0x40) {
      uVar7 = 0;
      local_38 = uVar6;
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 4) {
        uVar4 = PTM_BestColor(this_01,(uint32 *)&GPalette,
                              ((uint)((ulong)pFVar5 >> 4) & 0xfffffff) + (int)pFVar5 * 4,
                              ((uint)(uVar6 >> 4) & 0xfffffff) + (int)uVar6 * 4,
                              (int)(uVar7 >> 4) + (int)lVar9,0,0x100);
        uVar4 = uVar4 & 0xff;
        BVar1 = GPalette.BaseColors[uVar4].field_0.field_0.b;
        BVar2 = GPalette.BaseColors[uVar4].field_0.field_0.g;
        (lut.Array + (long)puVar8)[lVar9] = GPalette.BaseColors[uVar4].field_0.field_0.r;
        (lut.Array + (long)puVar8)[lVar9 + 1] = BVar2;
        (lut.Array + (long)puVar8)[lVar9 + 2] = BVar1;
        (lut.Array + (long)puVar8)[lVar9 + 3] = 0xff;
        uVar7 = uVar7 + 1;
      }
      puVar8 = puVar8 + 0x40;
      uVar6 = local_38 + 1;
    }
    puVar8 = local_40 + 0x1000;
    pFVar5 = (FShaderManager *)((long)&(local_48->mTextureEffects).Array + 1);
  }
  this_00 = (FHardwareTexture *)operator_new(0x30);
  FHardwareTexture::FHardwareTexture(this_00,0x200,0x200,true);
  buffer = lut.Array;
  (pAVar3->SpriteRotation).Degrees = (double)this_00;
  FString::FString(&local_58,"mTonemapPalette");
  FHardwareTexture::CreateTexture(this_00,buffer,0x200,0x200,texunit,false,0,&local_58);
  FString::~FString(&local_58);
  (*_ptrc_glActiveTexture)(texunit + 0x84c0);
  (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
  (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
  (*_ptrc_glActiveTexture)(0x84c0);
  TArray<unsigned_char,_unsigned_char>::~TArray(&lut);
  return;
}

Assistant:

void FGLRenderer::BindTonemapPalette(int texunit)
{
	if (mTonemapPalette)
	{
		mTonemapPalette->Bind(texunit, 0, false);
	}
	else
	{
		TArray<unsigned char> lut;
		lut.Resize(512 * 512 * 4);
		for (int r = 0; r < 64; r++)
		{
			for (int g = 0; g < 64; g++)
			{
				for (int b = 0; b < 64; b++)
				{
					PalEntry color = GPalette.BaseColors[(BYTE)PTM_BestColor((uint32 *)GPalette.BaseColors, (r << 2) | (r >> 4), (g << 2) | (g >> 4), (b << 2) | (b >> 4), 0, 256)];
					int index = ((r * 64 + g) * 64 + b) * 4;
					lut[index] = color.r;
					lut[index + 1] = color.g;
					lut[index + 2] = color.b;
					lut[index + 3] = 255;
				}
			}
		}

		mTonemapPalette = new FHardwareTexture(512, 512, true);
		mTonemapPalette->CreateTexture(&lut[0], 512, 512, texunit, false, 0, "mTonemapPalette");

		glActiveTexture(GL_TEXTURE0 + texunit);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glActiveTexture(GL_TEXTURE0);
	}
}